

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<double>_>::AddKel
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destination)

{
  complex<double> *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  complex<double> *pcVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar2 = source->fNElements;
  if (0 < lVar2) {
    lVar12 = 0;
    do {
      lVar3 = destination->fStore[lVar12];
      lVar4 = source->fStore[lVar12];
      lVar11 = lVar12;
      do {
        lVar9 = destination->fStore[lVar11];
        lVar8 = -(lVar3 - lVar9);
        lVar10 = lVar3 - lVar9;
        if (lVar10 != 0 && lVar9 <= lVar3) {
          lVar9 = lVar3;
          lVar8 = lVar10;
        }
        lVar10 = source->fStore[lVar11];
        if ((((lVar4 < 0) ||
             ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar4)) ||
            (lVar10 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar10)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar5 = (this->fElem).fStore[lVar9];
        dVar6 = *(double *)
                 (elmat->fElem
                  [lVar10 * (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow
                   + lVar4]._M_value + 8);
        pcVar1 = pcVar5 + lVar8;
        dVar7 = *(double *)(pcVar1->_M_value + 8);
        pcVar5 = pcVar5 + lVar8;
        *(double *)pcVar5->_M_value =
             *(double *)pcVar1->_M_value +
             *(double *)
              elmat->fElem
              [lVar10 * (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow +
               lVar4]._M_value;
        *(double *)(pcVar5->_M_value + 8) = dVar7 + dVar6;
        lVar11 = lVar11 + 1;
      } while (lVar11 < lVar2);
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar2);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddKel(TPZFMatrix<TVar>&elmat,
                                 TPZVec<int64_t> &source,
                                 TPZVec<int64_t> &destination)
{
    int64_t nelem = source.NElements();
    int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    for(icoef=0; icoef<nelem; icoef++) {
        ieq = destination[icoef];
        ieqs = source[icoef];
        for(jcoef=icoef; jcoef<nelem; jcoef++) {
            jeq = destination[jcoef];
            jeqs = source[jcoef];
            int64_t row(ieq), col(jeq);
            // invertendo linha-coluna para triangular superior
            if (row > col)
                this->Swap(&row, &col);
#ifdef PZDEBUG
            // checando limites
            if(row >= this->Dim() || col >= this->Dim()) {
                cout << "TPZSkylMatrix::GetVal index out of range row = " <<
                row << " col = " << col << endl;
                DebugStop();
            }
#endif
            // indice do vetor coluna
            int64_t index = col - row;
#ifdef PZDEBUG
            // checando limite da coluna
            if (index >= Size(col)) {
                cerr << "Try TPZSkylMatrix gZero." << endl;
                DebugStop();
            }
#endif
            // executando contribuição
            fElem[col][index] += elmat(ieqs,jeqs);

        }
    }
}